

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4faa5c::LiteralOperator::printLeft(LiteralOperator *this,OutputStream *S)

{
  StringView R;
  
  R.Last = "";
  R.First = "operator\"\" ";
  OutputStream::operator+=(S,R);
  Node::print(this->OpName,S);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "operator\"\" ";
    OpName->print(S);
  }